

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# integrators.cpp
# Opt level: O2

SampledSpectrum __thiscall
pbrt::PathIntegrator::Li
          (PathIntegrator *this,RayDifferential *ray,SampledWavelengths *lambda,
          SamplerHandle *sampler,ScratchBuffer *scratchBuffer,VisibleSurface *visibleSurface)

{
  Vector3f *this_00;
  TaggedPointer<pbrt::PointLight,pbrt::DistantLight,pbrt::ProjectionLight,pbrt::GoniometricLight,pbrt::SpotLight,pbrt::DiffuseAreaLight,pbrt::UniformInfiniteLight,pbrt::ImageInfiniteLight,pbrt::PortalImageInfiniteLight>
  *pTVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  undefined1 auVar10 [64];
  undefined1 auVar11 [64];
  undefined1 auVar12 [64];
  undefined1 auVar13 [64];
  undefined1 auVar14 [64];
  undefined1 auVar15 [64];
  undefined1 auVar16 [64];
  undefined1 auVar17 [64];
  undefined1 auVar18 [64];
  undefined1 auVar19 [64];
  undefined1 auVar20 [64];
  undefined1 auVar21 [64];
  undefined1 auVar22 [64];
  undefined1 auVar23 [64];
  undefined1 auVar24 [64];
  undefined1 auVar25 [64];
  undefined1 auVar26 [64];
  undefined1 auVar27 [64];
  undefined1 auVar28 [64];
  anon_class_24_3_20c75c41 func;
  anon_class_24_3_20c75c41 func_00;
  Vector3f wiRender;
  undefined1 auVar29 [32];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  int iVar32;
  bool bVar33;
  byte bVar34;
  ShapeIntersection *pSVar35;
  ShapeIntersection *pSVar36;
  long lVar37;
  BxDFFlags BVar38;
  long lVar39;
  int iVar40;
  LightHandle *light;
  TaggedPointer<pbrt::PointLight,pbrt::DistantLight,pbrt::ProjectionLight,pbrt::GoniometricLight,pbrt::SpotLight,pbrt::DiffuseAreaLight,pbrt::UniformInfiniteLight,pbrt::ImageInfiniteLight,pbrt::PortalImageInfiniteLight>
  *this_01;
  uint64_t a;
  long in_FS_OFFSET;
  Float FVar41;
  Float FVar42;
  type tVar43;
  ulong uVar73;
  undefined1 auVar44 [64];
  undefined1 auVar45 [64];
  undefined1 auVar46 [64];
  undefined1 auVar47 [64];
  undefined1 auVar48 [64];
  undefined1 auVar49 [64];
  undefined1 auVar75 [16];
  undefined1 auVar50 [64];
  undefined1 auVar51 [64];
  undefined1 auVar52 [64];
  undefined1 auVar53 [64];
  undefined1 auVar54 [64];
  undefined1 auVar55 [64];
  undefined1 auVar56 [64];
  undefined1 auVar57 [64];
  undefined1 auVar58 [64];
  undefined1 auVar59 [64];
  undefined1 auVar60 [64];
  undefined1 auVar61 [64];
  undefined1 extraout_var [56];
  undefined1 auVar62 [64];
  undefined1 auVar63 [64];
  undefined1 auVar64 [64];
  undefined1 auVar65 [64];
  undefined1 auVar66 [64];
  undefined1 auVar67 [64];
  undefined1 auVar68 [64];
  undefined1 auVar69 [64];
  undefined1 extraout_var_01 [56];
  undefined1 auVar70 [64];
  undefined1 auVar71 [64];
  undefined1 auVar72 [64];
  uint uVar79;
  undefined1 in_ZMM1 [64];
  undefined1 auVar76 [64];
  undefined1 auVar78 [56];
  undefined1 auVar77 [64];
  anon_class_16_2_2793a994 func_01;
  anon_class_16_2_d8f97178 func_02;
  anon_class_16_2_d8f97178 func_03;
  Vector3<float> VVar80;
  SampledSpectrum SVar81;
  uint local_428;
  Float f;
  SampledSpectrum albedo;
  BSDFSample bs;
  Point2f u;
  SampledSpectrum beta;
  undefined1 local_398 [16];
  SampledSpectrum L;
  SampledSpectrum rrBeta;
  Vector3<float> VStack_368;
  float fStack_35c;
  TaggedPointer<pbrt::HomogeneousMedium,_pbrt::GeneralMedium<pbrt::UniformGridMediumProvider>,_pbrt::GeneralMedium<pbrt::CloudMediumProvider>,_pbrt::GeneralMedium<pbrt::NanoVDBMediumProvider>_>
  TStack_358;
  undefined8 uStack_350;
  float fStack_348;
  float fStack_344;
  float fStack_340;
  float fStack_33c;
  float local_338;
  float fStack_334;
  float fStack_330;
  undefined8 uStack_32c;
  undefined8 uStack_324;
  SampledSpectrum Le;
  BSDF bsdf;
  LightHandle local_2a0;
  bool *local_298;
  ScratchBuffer *local_290;
  TaggedPointer<pbrt::HaltonSampler,_pbrt::PaddedSobolSampler,_pbrt::PMJ02BNSampler,_pbrt::RandomSampler,_pbrt::SobolSampler,_pbrt::StratifiedSampler,_pbrt::MLTSampler,_pbrt::DebugMLTSampler>
  local_288;
  uintptr_t local_280;
  TaggedPointer<pbrt::PerspectiveCamera,_pbrt::OrthographicCamera,_pbrt::SphericalCamera,_pbrt::RealisticCamera>
  local_278;
  TaggedPointer<pbrt::PointLight,_pbrt::DistantLight,_pbrt::ProjectionLight,_pbrt::GoniometricLight,_pbrt::SpotLight,_pbrt::DiffuseAreaLight,_pbrt::UniformInfiniteLight,_pbrt::ImageInfiniteLight,_pbrt::PortalImageInfiniteLight>
  local_270;
  undefined1 local_268 [16];
  Interval<float> local_258;
  Interval<float> IStack_250;
  Interval<float> local_248;
  undefined8 local_240;
  float fStack_238;
  float fStack_234;
  float fStack_230;
  float fStack_22c;
  Interval<float> local_228;
  Interval<float> IStack_220;
  Interval<float> local_218;
  undefined8 local_210;
  float fStack_208;
  float fStack_204;
  float fStack_200;
  float fStack_1fc;
  Interval<float> local_1f8;
  Interval<float> IStack_1f0;
  Interval<float> IStack_1e8;
  undefined4 uStack_1e0;
  undefined4 uStack_1dc;
  undefined4 uStack_1d8;
  undefined4 uStack_1d4;
  float fStack_1d0;
  float fStack_1cc;
  float fStack_1c8;
  undefined4 uStack_1c4;
  undefined4 uStack_1c0;
  undefined4 uStack_1bc;
  optional<pbrt::ShapeIntersection> si;
  float fStack_78;
  float fStack_74;
  float fStack_70;
  undefined1 auVar74 [56];
  undefined1 extraout_var_00 [56];
  
  local_290 = scratchBuffer;
  SampledSpectrum::SampledSpectrum(&L,0.0);
  SampledSpectrum::SampledSpectrum(&beta,1.0);
  iVar32 = 0;
  bVar34 = 0;
  local_428 = 0;
  local_1f8.low = 0.0;
  local_1f8.high = 0.0;
  IStack_1f0.low = 0.0;
  IStack_1f0.high = 0.0;
  IStack_1e8.low = 0.0;
  IStack_1e8.high = 0.0;
  uStack_1e0 = 0;
  uStack_1dc = 0;
  uStack_1d8 = 0;
  uStack_1d4 = 0;
  fStack_1d0 = 0.0;
  fStack_1cc = 0.0;
  fStack_1c8 = 0.0;
  uStack_1c4 = 0;
  uStack_1c0 = 0;
  fStack_78 = 0.0;
  fStack_74 = 0.0;
  fStack_70 = 0.0;
  this_00 = &(ray->super_Ray).d;
  local_298 = &ray->hasDifferentials;
  local_268 = SUB6416(ZEXT464(0x3f800000),0);
  do {
    auVar74 = ZEXT856(0);
    auVar76 = ZEXT1664(in_ZMM1._0_16_);
    Integrator::Intersect(&si,(Integrator *)this,&ray->super_Ray,INFINITY);
    auVar78 = auVar76._8_56_;
    iVar40 = iVar32;
    if (si.set == false) {
      pTVar1 = *(TaggedPointer<pbrt::PointLight,pbrt::DistantLight,pbrt::ProjectionLight,pbrt::GoniometricLight,pbrt::SpotLight,pbrt::DiffuseAreaLight,pbrt::UniformInfiniteLight,pbrt::ImageInfiniteLight,pbrt::PortalImageInfiniteLight>
                 **)((long)&(this->super_RayIntegrator).super_ImageTileIntegrator.super_Integrator.
                            infiniteLights.
                            super__Vector_base<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_>
                            ._M_impl.super__Vector_impl_data + 8);
      this_01 = (TaggedPointer<pbrt::PointLight,pbrt::DistantLight,pbrt::ProjectionLight,pbrt::GoniometricLight,pbrt::SpotLight,pbrt::DiffuseAreaLight,pbrt::UniformInfiniteLight,pbrt::ImageInfiniteLight,pbrt::PortalImageInfiniteLight>
                 *)(this->super_RayIntegrator).super_ImageTileIntegrator.super_Integrator.
                   infiniteLights.
                   super__Vector_base<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_>._M_impl
                   .super__Vector_impl_data._M_start;
      auVar49 = ZEXT464((uint)(f * f));
      while( true ) {
        auVar75 = auVar76._0_16_;
        auVar78 = auVar76._8_56_;
        auVar74 = auVar49._8_56_;
        if (this_01 == pTVar1) break;
        func_01.lambda = lambda;
        func_01.ray = &ray->super_Ray;
        SVar81 = TaggedPointer<pbrt::PointLight,pbrt::DistantLight,pbrt::ProjectionLight,pbrt::GoniometricLight,pbrt::SpotLight,pbrt::DiffuseAreaLight,pbrt::UniformInfiniteLight,pbrt::ImageInfiniteLight,pbrt::PortalImageInfiniteLight>
                 ::
                 Dispatch<pbrt::LightHandle::Le(pbrt::Ray_const&,pbrt::SampledWavelengths_const&)const::_lambda(auto:1)_1_>
                           (this_01,func_01);
        auVar49._8_56_ = auVar78;
        auVar49._0_8_ = SVar81.values.values._8_8_;
        auVar50._0_8_ = SVar81.values.values._0_8_;
        auVar50._8_56_ = auVar74;
        Le.values.values = (array<float,_4>)vmovlhps_avx(auVar50._0_16_,auVar49._0_16_);
        auVar74 = ZEXT856(Le.values.values._8_8_);
        if (iVar32 == 0 || local_428 != 0) {
          SVar81 = SampledSpectrum::operator*(&beta,&Le);
          auVar12._8_56_ = auVar78;
          auVar12._0_8_ = SVar81.values.values._8_8_;
          auVar51._0_8_ = SVar81.values.values._0_8_;
          auVar51._8_56_ = auVar74;
          bsdf._0_16_ = vmovlhps_avx(auVar51._0_16_,auVar12._0_16_);
          auVar74 = ZEXT856(bsdf.bxdf.
                            super_TaggedPointer<pbrt::IdealDiffuseBxDF,_pbrt::DiffuseBxDF,_pbrt::CoatedDiffuseBxDF,_pbrt::CoatedConductorBxDF,_pbrt::DielectricInterfaceBxDF,_pbrt::ThinDielectricBxDF,_pbrt::HairBxDF,_pbrt::MeasuredBxDF,_pbrt::ConductorBxDF,_pbrt::BSSRDFAdapter>
                            .bits);
          SVar81 = SampledWavelengths::PDF(lambda);
          auVar13._8_56_ = auVar78;
          auVar13._0_8_ = SVar81.values.values._8_8_;
          auVar52._0_8_ = SVar81.values.values._0_8_;
          auVar52._8_56_ = auVar74;
          bs.f.values.values = (array<float,_4>)vmovlhps_avx(auVar52._0_16_,auVar13._0_16_);
          auVar74 = ZEXT856(bs.f.values.values._8_8_);
          SVar81 = SafeDiv((SampledSpectrum *)&bsdf,&bs.f);
          auVar76._8_56_ = auVar78;
          auVar76._0_8_ = SVar81.values.values._8_8_;
          auVar53._0_8_ = SVar81.values.values._0_8_;
          auVar53._8_56_ = auVar74;
          auVar75 = vmovlhps_avx(auVar53._0_16_,auVar76._0_16_);
          auVar49 = ZEXT1664(auVar75);
          rrBeta.values.values._0_8_ = auVar75._0_8_;
          rrBeta.values.values[2] = auVar75._8_4_;
          rrBeta.values.values[3] = auVar75._12_4_;
          SampledSpectrum::operator+=(&L,&rrBeta);
        }
        else {
          bsdf.shadingFrame.y.super_Tuple3<pbrt::Vector3,_float>.x = fStack_1cc;
          bsdf.shadingFrame.x.super_Tuple3<pbrt::Vector3,_float>.z = fStack_1d0;
          bsdf.shadingFrame.x.super_Tuple3<pbrt::Vector3,_float>.x = IStack_1e8.low;
          bsdf.shadingFrame.x.super_Tuple3<pbrt::Vector3,_float>.y = IStack_1e8.high;
          bsdf.bxdf.
          super_TaggedPointer<pbrt::IdealDiffuseBxDF,_pbrt::DiffuseBxDF,_pbrt::CoatedDiffuseBxDF,_pbrt::CoatedConductorBxDF,_pbrt::DielectricInterfaceBxDF,_pbrt::ThinDielectricBxDF,_pbrt::HairBxDF,_pbrt::MeasuredBxDF,_pbrt::ConductorBxDF,_pbrt::BSSRDFAdapter>
          .bits = (TaggedPointer<pbrt::IdealDiffuseBxDF,_pbrt::DiffuseBxDF,_pbrt::CoatedDiffuseBxDF,_pbrt::CoatedConductorBxDF,_pbrt::DielectricInterfaceBxDF,_pbrt::ThinDielectricBxDF,_pbrt::HairBxDF,_pbrt::MeasuredBxDF,_pbrt::ConductorBxDF,_pbrt::BSSRDFAdapter>
                   )(TaggedPointer<pbrt::IdealDiffuseBxDF,_pbrt::DiffuseBxDF,_pbrt::CoatedDiffuseBxDF,_pbrt::CoatedConductorBxDF,_pbrt::DielectricInterfaceBxDF,_pbrt::ThinDielectricBxDF,_pbrt::HairBxDF,_pbrt::MeasuredBxDF,_pbrt::ConductorBxDF,_pbrt::BSSRDFAdapter>
                     )IStack_1f0;
          bsdf.eta = local_1f8.low;
          bsdf._4_4_ = local_1f8.high;
          bsdf.shadingFrame.y.super_Tuple3<pbrt::Vector3,_float>.y = fStack_1c8;
          bsdf.shadingFrame.z.super_Tuple3<pbrt::Vector3,_float>.x = fStack_74;
          bsdf.shadingFrame.y.super_Tuple3<pbrt::Vector3,_float>.z = fStack_78;
          bsdf.shadingFrame.z.super_Tuple3<pbrt::Vector3,_float>.y = fStack_70;
          local_2a0.
          super_TaggedPointer<pbrt::PointLight,_pbrt::DistantLight,_pbrt::ProjectionLight,_pbrt::GoniometricLight,_pbrt::SpotLight,_pbrt::DiffuseAreaLight,_pbrt::UniformInfiniteLight,_pbrt::ImageInfiniteLight,_pbrt::PortalImageInfiniteLight>
          .bits = *(TaggedPointer<pbrt::PointLight,_pbrt::DistantLight,_pbrt::ProjectionLight,_pbrt::GoniometricLight,_pbrt::SpotLight,_pbrt::DiffuseAreaLight,_pbrt::UniformInfiniteLight,_pbrt::ImageInfiniteLight,_pbrt::PortalImageInfiniteLight>
                    *)this_01;
          func_02.light = &local_2a0;
          func_02.ctx = (LightSampleContext *)&bsdf;
          FVar41 = TaggedPointer<pbrt::UniformLightSampler,pbrt::PowerLightSampler,pbrt::BVHLightSampler,pbrt::ExhaustiveLightSampler>
                   ::
                   Dispatch<pbrt::LightSamplerHandle::PDF(pbrt::LightSampleContext_const&,pbrt::LightHandle)const::_lambda(auto:1)_1_>
                             ((TaggedPointer<pbrt::UniformLightSampler,pbrt::PowerLightSampler,pbrt::BVHLightSampler,pbrt::ExhaustiveLightSampler>
                               *)&this->lightSampler,func_02);
          local_210 = CONCAT44(fStack_1cc,fStack_1d0);
          local_218 = IStack_1e8;
          local_228 = local_1f8;
          IStack_220 = IStack_1f0;
          fStack_208 = fStack_1c8;
          fStack_1fc = fStack_70;
          fStack_204 = fStack_78;
          fStack_200 = fStack_74;
          auVar75._8_4_ = fStack_1c8;
          auVar75._0_8_ = local_210;
          auVar75._12_4_ = fStack_78;
          uStack_350._4_4_ = fStack_70;
          uStack_350._0_4_ = fStack_74;
          auVar31._12_4_ = 0;
          auVar31._0_12_ = local_398._4_12_;
          local_398 = auVar31 << 0x20;
          VStack_368.super_Tuple3<pbrt::Vector3,_float>.x = IStack_1e8.low;
          VStack_368.super_Tuple3<pbrt::Vector3,_float>.y = IStack_1e8.high;
          bs.f.values.values._8_8_ = &albedo;
          bs.f.values.values._0_8_ = &rrBeta;
          bs.wi.super_Tuple3<pbrt::Vector3,_float>._0_8_ = local_398;
          rrBeta.values.values[0] = local_1f8.low;
          rrBeta.values.values[1] = local_1f8.high;
          rrBeta.values.values[2] = IStack_1f0.low;
          rrBeta.values.values[3] = IStack_1f0.high;
          VStack_368.super_Tuple3<pbrt::Vector3,_float>.z = fStack_1d0;
          fStack_35c = fStack_1cc;
          TStack_358.bits = auVar75._8_8_;
          albedo.values.values._0_12_ = (ray->super_Ray).d.super_Tuple3<pbrt::Vector3,_float>;
          func.wi = (Vector3f *)&albedo;
          func.ctx = (LightSampleContext *)&rrBeta;
          func.mode = (LightSamplingMode *)bs.wi.super_Tuple3<pbrt::Vector3,_float>._0_8_;
          FVar42 = TaggedPointer<pbrt::PointLight,pbrt::DistantLight,pbrt::ProjectionLight,pbrt::GoniometricLight,pbrt::SpotLight,pbrt::DiffuseAreaLight,pbrt::UniformInfiniteLight,pbrt::ImageInfiniteLight,pbrt::PortalImageInfiniteLight>
                   ::
                   Dispatch<pbrt::LightHandle::PDF_Li(pbrt::LightSampleContext,pbrt::Vector3<float>,pbrt::LightSamplingMode)const::_lambda(auto:1)_1_>
                             (this_01,func);
          auVar75 = vfmadd231ss_fma(ZEXT416((uint)(FVar42 * FVar41 * FVar42 * FVar41)),
                                    ZEXT416((uint)f),ZEXT416((uint)f));
          auVar78 = (undefined1  [56])0x0;
          auVar74 = ZEXT856(0);
          SVar81 = SampledSpectrum::operator*(&beta,(f * f) / auVar75._0_4_);
          auVar14._8_56_ = auVar78;
          auVar14._0_8_ = SVar81.values.values._8_8_;
          auVar54._0_8_ = SVar81.values.values._0_8_;
          auVar54._8_56_ = auVar74;
          bs.f.values.values = (array<float,_4>)vmovlhps_avx(auVar54._0_16_,auVar14._0_16_);
          auVar74 = ZEXT856(bs.f.values.values._8_8_);
          SVar81 = SampledSpectrum::operator*(&bs.f,&Le);
          auVar15._8_56_ = auVar78;
          auVar15._0_8_ = SVar81.values.values._8_8_;
          auVar55._0_8_ = SVar81.values.values._0_8_;
          auVar55._8_56_ = auVar74;
          bsdf._0_16_ = vmovlhps_avx(auVar55._0_16_,auVar15._0_16_);
          auVar74 = ZEXT856(bsdf.bxdf.
                            super_TaggedPointer<pbrt::IdealDiffuseBxDF,_pbrt::DiffuseBxDF,_pbrt::CoatedDiffuseBxDF,_pbrt::CoatedConductorBxDF,_pbrt::DielectricInterfaceBxDF,_pbrt::ThinDielectricBxDF,_pbrt::HairBxDF,_pbrt::MeasuredBxDF,_pbrt::ConductorBxDF,_pbrt::BSSRDFAdapter>
                            .bits);
          SVar81 = SampledWavelengths::PDF(lambda);
          auVar16._8_56_ = auVar78;
          auVar16._0_8_ = SVar81.values.values._8_8_;
          auVar56._0_8_ = SVar81.values.values._0_8_;
          auVar56._8_56_ = auVar74;
          albedo.values.values = (array<float,_4>)vmovlhps_avx(auVar56._0_16_,auVar16._0_16_);
          auVar74 = ZEXT856(albedo.values.values._8_8_);
          SVar81 = SafeDiv((SampledSpectrum *)&bsdf,&albedo);
          auVar76._8_56_ = auVar78;
          auVar76._0_8_ = SVar81.values.values._8_8_;
          auVar57._0_8_ = SVar81.values.values._0_8_;
          auVar57._8_56_ = auVar74;
          auVar75 = vmovlhps_avx(auVar57._0_16_,auVar76._0_16_);
          auVar49 = ZEXT1664(auVar75);
          rrBeta.values.values._0_8_ = auVar75._0_8_;
          rrBeta.values.values[2] = auVar75._8_4_;
          rrBeta.values.values[3] = auVar75._12_4_;
          SampledSpectrum::operator+=(&L,&rrBeta);
        }
        this_01 = this_01 + 8;
      }
      bVar33 = true;
    }
    else {
      pSVar35 = pstd::optional<pbrt::ShapeIntersection>::value(&si);
      VVar80 = Tuple3<pbrt::Vector3,_float>::operator-(&this_00->super_Tuple3<pbrt::Vector3,_float>)
      ;
      rrBeta.values.values[2] = VVar80.super_Tuple3<pbrt::Vector3,_float>.z;
      auVar44._0_8_ = VVar80.super_Tuple3<pbrt::Vector3,_float>._0_8_;
      auVar44._8_56_ = auVar74;
      rrBeta.values.values._0_8_ = vmovlps_avx(auVar44._0_16_);
      SVar81 = SurfaceInteraction::Le(&pSVar35->intr,(Vector3f *)&rrBeta,lambda);
      auVar77._8_56_ = auVar78;
      auVar77._0_8_ = SVar81.values.values._8_8_;
      auVar45._0_8_ = SVar81.values.values._0_8_;
      auVar45._8_56_ = auVar74;
      Le.values.values = (array<float,_4>)vmovlhps_avx(auVar45._0_16_,auVar77._0_16_);
      auVar74 = ZEXT856(Le.values.values._8_8_);
      bVar33 = SampledSpectrum::operator_cast_to_bool(&Le);
      uVar73 = auVar74._0_8_;
      auVar78 = auVar77._8_56_;
      if (bVar33) {
        if ((iVar32 == 0) || (local_428 != 0)) {
          SVar81 = SampledSpectrum::operator*(&beta,&Le);
          auVar10._8_56_ = auVar78;
          auVar10._0_8_ = SVar81.values.values._8_8_;
          auVar46._0_8_ = SVar81.values.values._0_8_;
          auVar46._8_56_ = auVar74;
          bsdf._0_16_ = vmovlhps_avx(auVar46._0_16_,auVar10._0_16_);
          auVar74 = ZEXT856(bsdf.bxdf.
                            super_TaggedPointer<pbrt::IdealDiffuseBxDF,_pbrt::DiffuseBxDF,_pbrt::CoatedDiffuseBxDF,_pbrt::CoatedConductorBxDF,_pbrt::DielectricInterfaceBxDF,_pbrt::ThinDielectricBxDF,_pbrt::HairBxDF,_pbrt::MeasuredBxDF,_pbrt::ConductorBxDF,_pbrt::BSSRDFAdapter>
                            .bits);
          SVar81 = SampledWavelengths::PDF(lambda);
          auVar11._8_56_ = auVar78;
          auVar11._0_8_ = SVar81.values.values._8_8_;
          auVar47._0_8_ = SVar81.values.values._0_8_;
          auVar47._8_56_ = auVar74;
          bs.f.values.values = (array<float,_4>)vmovlhps_avx(auVar47._0_16_,auVar11._0_16_);
          auVar74 = ZEXT856(bs.f.values.values._8_8_);
          SVar81 = SafeDiv((SampledSpectrum *)&bsdf,&bs.f);
          auVar77._8_56_ = auVar78;
          auVar77._0_8_ = SVar81.values.values._8_8_;
          auVar48._0_8_ = SVar81.values.values._0_8_;
          auVar48._8_56_ = auVar74;
          auVar75 = auVar48._0_16_;
        }
        else {
          pSVar35 = pstd::optional<pbrt::ShapeIntersection>::value(&si);
          local_270.bits =
               (pSVar35->intr).areaLight.
               super_TaggedPointer<pbrt::PointLight,_pbrt::DistantLight,_pbrt::ProjectionLight,_pbrt::GoniometricLight,_pbrt::SpotLight,_pbrt::DiffuseAreaLight,_pbrt::UniformInfiniteLight,_pbrt::ImageInfiniteLight,_pbrt::PortalImageInfiniteLight>
               .bits;
          bsdf.shadingFrame.y.super_Tuple3<pbrt::Vector3,_float>.x = fStack_1cc;
          bsdf.shadingFrame.x.super_Tuple3<pbrt::Vector3,_float>.z = fStack_1d0;
          bsdf.shadingFrame.x.super_Tuple3<pbrt::Vector3,_float>.x = IStack_1e8.low;
          bsdf.shadingFrame.x.super_Tuple3<pbrt::Vector3,_float>.y = IStack_1e8.high;
          local_398._0_8_ = local_270.bits;
          bsdf.bxdf.
          super_TaggedPointer<pbrt::IdealDiffuseBxDF,_pbrt::DiffuseBxDF,_pbrt::CoatedDiffuseBxDF,_pbrt::CoatedConductorBxDF,_pbrt::DielectricInterfaceBxDF,_pbrt::ThinDielectricBxDF,_pbrt::HairBxDF,_pbrt::MeasuredBxDF,_pbrt::ConductorBxDF,_pbrt::BSSRDFAdapter>
          .bits = (TaggedPointer<pbrt::IdealDiffuseBxDF,_pbrt::DiffuseBxDF,_pbrt::CoatedDiffuseBxDF,_pbrt::CoatedConductorBxDF,_pbrt::DielectricInterfaceBxDF,_pbrt::ThinDielectricBxDF,_pbrt::HairBxDF,_pbrt::MeasuredBxDF,_pbrt::ConductorBxDF,_pbrt::BSSRDFAdapter>
                   )(TaggedPointer<pbrt::IdealDiffuseBxDF,_pbrt::DiffuseBxDF,_pbrt::CoatedDiffuseBxDF,_pbrt::CoatedConductorBxDF,_pbrt::DielectricInterfaceBxDF,_pbrt::ThinDielectricBxDF,_pbrt::HairBxDF,_pbrt::MeasuredBxDF,_pbrt::ConductorBxDF,_pbrt::BSSRDFAdapter>
                     )IStack_1f0;
          bsdf.eta = local_1f8.low;
          bsdf._4_4_ = local_1f8.high;
          bsdf.shadingFrame.y.super_Tuple3<pbrt::Vector3,_float>.y = fStack_1c8;
          bsdf.shadingFrame.z.super_Tuple3<pbrt::Vector3,_float>.x = fStack_74;
          bsdf.shadingFrame.y.super_Tuple3<pbrt::Vector3,_float>.z = fStack_78;
          bsdf.shadingFrame.z.super_Tuple3<pbrt::Vector3,_float>.y = fStack_70;
          func_03.light = (LightHandle *)&local_270;
          func_03.ctx = (LightSampleContext *)&bsdf;
          FVar41 = TaggedPointer<pbrt::UniformLightSampler,pbrt::PowerLightSampler,pbrt::BVHLightSampler,pbrt::ExhaustiveLightSampler>
                   ::
                   Dispatch<pbrt::LightSamplerHandle::PDF(pbrt::LightSampleContext_const&,pbrt::LightHandle)const::_lambda(auto:1)_1_>
                             ((TaggedPointer<pbrt::UniformLightSampler,pbrt::PowerLightSampler,pbrt::BVHLightSampler,pbrt::ExhaustiveLightSampler>
                               *)&this->lightSampler,func_03);
          local_240 = CONCAT44(fStack_1cc,fStack_1d0);
          local_248 = IStack_1e8;
          local_258 = local_1f8;
          IStack_250 = IStack_1f0;
          fStack_238 = fStack_1c8;
          fStack_22c = fStack_70;
          fStack_234 = fStack_78;
          fStack_230 = fStack_74;
          auVar30._8_4_ = fStack_1c8;
          auVar30._0_8_ = local_240;
          auVar30._12_4_ = fStack_78;
          uStack_350._4_4_ = fStack_70;
          uStack_350._0_4_ = fStack_74;
          u.super_Tuple2<pbrt::Point2,_float>.x = 0.0;
          VStack_368.super_Tuple3<pbrt::Vector3,_float>.x = IStack_1e8.low;
          VStack_368.super_Tuple3<pbrt::Vector3,_float>.y = IStack_1e8.high;
          bs.f.values.values._8_8_ = &albedo;
          bs.f.values.values._0_8_ = &rrBeta;
          bs.wi.super_Tuple3<pbrt::Vector3,_float>._0_8_ = &u;
          rrBeta.values.values[0] = local_1f8.low;
          rrBeta.values.values[1] = local_1f8.high;
          rrBeta.values.values[2] = IStack_1f0.low;
          rrBeta.values.values[3] = IStack_1f0.high;
          VStack_368.super_Tuple3<pbrt::Vector3,_float>.z = fStack_1d0;
          fStack_35c = fStack_1cc;
          TStack_358.bits = auVar30._8_8_;
          albedo.values.values._0_12_ = (ray->super_Ray).d.super_Tuple3<pbrt::Vector3,_float>;
          func_00.wi = (Vector3f *)&albedo;
          func_00.ctx = (LightSampleContext *)&rrBeta;
          func_00.mode = (LightSamplingMode *)bs.wi.super_Tuple3<pbrt::Vector3,_float>._0_8_;
          FVar42 = TaggedPointer<pbrt::PointLight,pbrt::DistantLight,pbrt::ProjectionLight,pbrt::GoniometricLight,pbrt::SpotLight,pbrt::DiffuseAreaLight,pbrt::UniformInfiniteLight,pbrt::ImageInfiniteLight,pbrt::PortalImageInfiniteLight>
                   ::
                   Dispatch<pbrt::LightHandle::PDF_Li(pbrt::LightSampleContext,pbrt::Vector3<float>,pbrt::LightSamplingMode)const::_lambda(auto:1)_1_>
                             ((TaggedPointer<pbrt::PointLight,pbrt::DistantLight,pbrt::ProjectionLight,pbrt::GoniometricLight,pbrt::SpotLight,pbrt::DiffuseAreaLight,pbrt::UniformInfiniteLight,pbrt::ImageInfiniteLight,pbrt::PortalImageInfiniteLight>
                               *)local_398,func_00);
          auVar78 = (undefined1  [56])0x0;
          auVar75 = vfmadd231ss_fma(ZEXT416((uint)(FVar42 * FVar41 * FVar42 * FVar41)),
                                    ZEXT416((uint)f),ZEXT416((uint)f));
          auVar74 = ZEXT856(0);
          SVar81 = SampledSpectrum::operator*(&beta,(f * f) / auVar75._0_4_);
          auVar17._8_56_ = auVar78;
          auVar17._0_8_ = SVar81.values.values._8_8_;
          auVar58._0_8_ = SVar81.values.values._0_8_;
          auVar58._8_56_ = auVar74;
          bs.f.values.values = (array<float,_4>)vmovlhps_avx(auVar58._0_16_,auVar17._0_16_);
          auVar74 = ZEXT856(bs.f.values.values._8_8_);
          SVar81 = SampledSpectrum::operator*(&bs.f,&Le);
          auVar18._8_56_ = auVar78;
          auVar18._0_8_ = SVar81.values.values._8_8_;
          auVar59._0_8_ = SVar81.values.values._0_8_;
          auVar59._8_56_ = auVar74;
          bsdf._0_16_ = vmovlhps_avx(auVar59._0_16_,auVar18._0_16_);
          auVar74 = ZEXT856(bsdf.bxdf.
                            super_TaggedPointer<pbrt::IdealDiffuseBxDF,_pbrt::DiffuseBxDF,_pbrt::CoatedDiffuseBxDF,_pbrt::CoatedConductorBxDF,_pbrt::DielectricInterfaceBxDF,_pbrt::ThinDielectricBxDF,_pbrt::HairBxDF,_pbrt::MeasuredBxDF,_pbrt::ConductorBxDF,_pbrt::BSSRDFAdapter>
                            .bits);
          SVar81 = SampledWavelengths::PDF(lambda);
          auVar19._8_56_ = auVar78;
          auVar19._0_8_ = SVar81.values.values._8_8_;
          auVar60._0_8_ = SVar81.values.values._0_8_;
          auVar60._8_56_ = auVar74;
          albedo.values.values = (array<float,_4>)vmovlhps_avx(auVar60._0_16_,auVar19._0_16_);
          auVar74 = ZEXT856(albedo.values.values._8_8_);
          SVar81 = SafeDiv((SampledSpectrum *)&bsdf,&albedo);
          auVar77._8_56_ = auVar78;
          auVar77._0_8_ = SVar81.values.values._8_8_;
          auVar61._0_8_ = SVar81.values.values._0_8_;
          auVar61._8_56_ = auVar74;
          auVar75 = auVar61._0_16_;
        }
        auVar75 = vmovlhps_avx(auVar75,auVar77._0_16_);
        uVar73 = auVar75._8_8_;
        rrBeta.values.values._0_8_ = auVar75._0_8_;
        rrBeta.values.values[2] = auVar75._8_4_;
        rrBeta.values.values[3] = auVar75._12_4_;
        SampledSpectrum::operator+=(&L,&rrBeta);
      }
      pSVar35 = pstd::optional<pbrt::ShapeIntersection>::value(&si);
      local_278.bits =
           (this->super_RayIntegrator).super_ImageTileIntegrator.camera.
           super_TaggedPointer<pbrt::PerspectiveCamera,_pbrt::OrthographicCamera,_pbrt::SphericalCamera,_pbrt::RealisticCamera>
           .bits;
      local_280 = (sampler->
                  super_TaggedPointer<pbrt::HaltonSampler,_pbrt::PaddedSobolSampler,_pbrt::PMJ02BNSampler,_pbrt::RandomSampler,_pbrt::SobolSampler,_pbrt::StratifiedSampler,_pbrt::MLTSampler,_pbrt::DebugMLTSampler>
                  ).bits;
      SurfaceInteraction::GetBSDF
                (&bsdf,&pSVar35->intr,ray,lambda,(CameraHandle *)&local_278,local_290,
                 (SamplerHandle)&local_280);
      auVar75 = auVar77._0_16_;
      if (((undefined1  [16])bsdf._0_16_ & (undefined1  [16])0xffffffffffff) ==
          (undefined1  [16])0x0) {
        pSVar36 = pstd::optional<pbrt::ShapeIntersection>::value(&si);
        SurfaceInteraction::SkipIntersection(&pSVar35->intr,ray,pSVar36->tHit);
        bVar33 = false;
      }
      else {
        if (iVar32 == 0 && visibleSurface != (VisibleSurface *)0x0) {
          SampledSpectrum::SampledSpectrum(&bs.f,0.0);
          for (a = 1; auVar78 = auVar77._8_56_, a != 0x11; a = a + 1) {
            FVar41 = RadicalInverse(0,a);
            FVar42 = RadicalInverse(1,a);
            u.super_Tuple2<pbrt::Point2,_float>.y = RadicalInverse(2,a);
            u.super_Tuple2<pbrt::Point2,_float>.x = FVar42;
            pSVar36 = pstd::optional<pbrt::ShapeIntersection>::value(&si);
            auVar77 = ZEXT6064((undefined1  [60])0x0) << 0x20;
            BSDF::Sample_f((BSDFSample *)&rrBeta,&bsdf,
                           (Vector3f)
                           (pSVar36->intr).super_Interaction.wo.super_Tuple3<pbrt::Vector3,_float>,
                           FVar41,&u,Radiance,All);
            auVar78 = auVar77._8_56_;
            if (0.0 < fStack_35c) {
              pSVar36 = pstd::optional<pbrt::ShapeIntersection>::value(&si);
              tVar43 = AbsDot<float>(&VStack_368,&(pSVar36->intr).shading.n);
              auVar74 = extraout_var;
              SVar81 = SampledSpectrum::operator*(&rrBeta,tVar43);
              auVar20._8_56_ = auVar78;
              auVar20._0_8_ = SVar81.values.values._8_8_;
              auVar62._0_8_ = SVar81.values.values._0_8_;
              auVar62._8_56_ = auVar74;
              local_398 = vmovlhps_avx(auVar62._0_16_,auVar20._0_16_);
              auVar74 = (undefined1  [56])0x0;
              SVar81 = SampledSpectrum::operator/((SampledSpectrum *)local_398,fStack_35c);
              auVar77._8_56_ = auVar78;
              auVar77._0_8_ = SVar81.values.values._8_8_;
              auVar63._0_8_ = SVar81.values.values._0_8_;
              auVar63._8_56_ = auVar74;
              albedo.values.values = (array<float,_4>)vmovlhps_avx(auVar63._0_16_,auVar77._0_16_);
              SampledSpectrum::operator+=(&bs.f,&albedo);
            }
          }
          auVar74 = (undefined1  [56])0x0;
          SVar81 = SampledSpectrum::operator/(&bs.f,16.0);
          auVar21._8_56_ = auVar78;
          auVar21._0_8_ = SVar81.values.values._8_8_;
          auVar64._0_8_ = SVar81.values.values._0_8_;
          auVar64._8_56_ = auVar74;
          auVar75 = auVar21._0_16_;
          albedo.values.values = (array<float,_4>)vmovlhps_avx(auVar64._0_16_,auVar75);
          pSVar36 = pstd::optional<pbrt::ShapeIntersection>::value(&si);
          VisibleSurface::VisibleSurface
                    ((VisibleSurface *)&rrBeta,&pSVar36->intr,
                     (CameraTransform *)
                     ((this->super_RayIntegrator).super_ImageTileIntegrator.camera.
                      super_TaggedPointer<pbrt::PerspectiveCamera,_pbrt::OrthographicCamera,_pbrt::SphericalCamera,_pbrt::RealisticCamera>
                      .bits & 0xffffffffffff),&albedo,lambda);
          (visibleSurface->albedo).values.values[3] = local_338;
          uVar73 = CONCAT44(rrBeta.values.values[3],rrBeta.values.values[2]);
          *(undefined8 *)visibleSurface = rrBeta.values.values._0_8_;
          (visibleSurface->p).super_Tuple3<pbrt::Point3,_float>.y = rrBeta.values.values[2];
          (visibleSurface->p).super_Tuple3<pbrt::Point3,_float>.z = rrBeta.values.values[3];
          (visibleSurface->n).super_Tuple3<pbrt::Normal3,_float>.x =
               VStack_368.super_Tuple3<pbrt::Vector3,_float>.x;
          (visibleSurface->n).super_Tuple3<pbrt::Normal3,_float>.y =
               VStack_368.super_Tuple3<pbrt::Vector3,_float>.y;
          *(ulong *)&(visibleSurface->n).super_Tuple3<pbrt::Normal3,_float>.z =
               CONCAT44(fStack_35c,VStack_368.super_Tuple3<pbrt::Vector3,_float>.z);
          (visibleSurface->ns).super_Tuple3<pbrt::Normal3,_float>.y =
               (float)(undefined4)TStack_358.bits;
          (visibleSurface->ns).super_Tuple3<pbrt::Normal3,_float>.z = (float)TStack_358.bits._4_4_;
          *(undefined8 *)&visibleSurface->time = uStack_350;
          visibleSurface->dzdy = fStack_348;
          (visibleSurface->albedo).values.values[0] = fStack_344;
          *(ulong *)((visibleSurface->albedo).values.values + 1) = CONCAT44(fStack_33c,fStack_340);
        }
        uVar79 = auVar75._12_4_;
        iVar40 = iVar32 + 1;
        bVar33 = true;
        if (iVar32 != this->maxDepth) {
          if ((this->regularize & bVar34) == 1) {
            *(long *)(in_FS_OFFSET + -0x370) = *(long *)(in_FS_OFFSET + -0x370) + 1;
            TaggedPointer<pbrt::IdealDiffuseBxDF,pbrt::DiffuseBxDF,pbrt::CoatedDiffuseBxDF,pbrt::CoatedConductorBxDF,pbrt::DielectricInterfaceBxDF,pbrt::ThinDielectricBxDF,pbrt::HairBxDF,pbrt::MeasuredBxDF,pbrt::ConductorBxDF,pbrt::BSSRDFAdapter>
            ::Dispatch<pbrt::BxDFHandle::Regularize()::_lambda(auto:1)_1_>
                      ((TaggedPointer<pbrt::IdealDiffuseBxDF,pbrt::DiffuseBxDF,pbrt::CoatedDiffuseBxDF,pbrt::CoatedConductorBxDF,pbrt::DielectricInterfaceBxDF,pbrt::ThinDielectricBxDF,pbrt::HairBxDF,pbrt::MeasuredBxDF,pbrt::ConductorBxDF,pbrt::BSSRDFAdapter>
                        *)&bsdf.bxdf);
          }
          *(long *)(in_FS_OFFSET + -0x368) = *(long *)(in_FS_OFFSET + -0x368) + 1;
          auVar74 = ZEXT856(uVar73);
          auVar78 = ZEXT456(uVar79);
          bVar33 = BSDF::IsNonSpecular(&bsdf);
          if (bVar33) {
            *(long *)(in_FS_OFFSET + -0x360) = *(long *)(in_FS_OFFSET + -0x360) + 1;
            local_288.bits =
                 (sampler->
                 super_TaggedPointer<pbrt::HaltonSampler,_pbrt::PaddedSobolSampler,_pbrt::PMJ02BNSampler,_pbrt::RandomSampler,_pbrt::SobolSampler,_pbrt::StratifiedSampler,_pbrt::MLTSampler,_pbrt::DebugMLTSampler>
                 ).bits;
            SVar81 = SampleLd(this,&pSVar35->intr,&bsdf,lambda,(SamplerHandle *)&local_288);
            auVar22._8_56_ = auVar78;
            auVar22._0_8_ = SVar81.values.values._8_8_;
            auVar65._0_8_ = SVar81.values.values._0_8_;
            auVar65._8_56_ = auVar74;
            auVar75 = vmovlhps_avx(auVar65._0_16_,auVar22._0_16_);
            auVar74 = ZEXT856(auVar75._8_8_);
            rrBeta.values.values._0_8_ = auVar75._0_8_;
            rrBeta.values.values[2] = auVar75._8_4_;
            rrBeta.values.values[3] = auVar75._12_4_;
            bVar33 = SampledSpectrum::operator_cast_to_bool(&rrBeta);
            if (!bVar33) {
              *(long *)(in_FS_OFFSET + -0x358) = *(long *)(in_FS_OFFSET + -0x358) + 1;
            }
            SVar81 = SampledSpectrum::operator*(&beta,&rrBeta);
            auVar23._8_56_ = auVar78;
            auVar23._0_8_ = SVar81.values.values._8_8_;
            auVar66._0_8_ = SVar81.values.values._0_8_;
            auVar66._8_56_ = auVar74;
            albedo.values.values = (array<float,_4>)vmovlhps_avx(auVar66._0_16_,auVar23._0_16_);
            auVar74 = ZEXT856(albedo.values.values._8_8_);
            SVar81 = SampledWavelengths::PDF(lambda);
            auVar24._8_56_ = auVar78;
            auVar24._0_8_ = SVar81.values.values._8_8_;
            auVar67._0_8_ = SVar81.values.values._0_8_;
            auVar67._8_56_ = auVar74;
            local_398 = vmovlhps_avx(auVar67._0_16_,auVar24._0_16_);
            auVar74 = ZEXT856(local_398._8_8_);
            SVar81 = SafeDiv(&albedo,(SampledSpectrum *)local_398);
            auVar25._8_56_ = auVar78;
            auVar25._0_8_ = SVar81.values.values._8_8_;
            auVar68._0_8_ = SVar81.values.values._0_8_;
            auVar68._8_56_ = auVar74;
            bs.f.values.values = (array<float,_4>)vmovlhps_avx(auVar68._0_16_,auVar25._0_16_);
            SampledSpectrum::operator+=(&L,&bs.f);
          }
          VVar80 = Tuple3<pbrt::Vector3,_float>::operator-
                             (&this_00->super_Tuple3<pbrt::Vector3,_float>);
          FVar41 = TaggedPointer<pbrt::HaltonSampler,pbrt::PaddedSobolSampler,pbrt::PMJ02BNSampler,pbrt::RandomSampler,pbrt::SobolSampler,pbrt::StratifiedSampler,pbrt::MLTSampler,pbrt::DebugMLTSampler>
                   ::Dispatch<pbrt::SamplerHandle::Get1D()::_lambda(auto:1)_1_>
                             ((TaggedPointer<pbrt::HaltonSampler,pbrt::PaddedSobolSampler,pbrt::PMJ02BNSampler,pbrt::RandomSampler,pbrt::SobolSampler,pbrt::StratifiedSampler,pbrt::MLTSampler,pbrt::DebugMLTSampler>
                               *)sampler);
          auVar69._0_8_ =
               TaggedPointer<pbrt::HaltonSampler,pbrt::PaddedSobolSampler,pbrt::PMJ02BNSampler,pbrt::RandomSampler,pbrt::SobolSampler,pbrt::StratifiedSampler,pbrt::MLTSampler,pbrt::DebugMLTSampler>
               ::Dispatch<pbrt::SamplerHandle::Get2D()::_lambda(auto:1)_1_>
                         ((TaggedPointer<pbrt::HaltonSampler,pbrt::PaddedSobolSampler,pbrt::PMJ02BNSampler,pbrt::RandomSampler,pbrt::SobolSampler,pbrt::StratifiedSampler,pbrt::MLTSampler,pbrt::DebugMLTSampler>
                           *)sampler);
          auVar69._8_56_ = extraout_var_00;
          rrBeta.values.values._0_8_ = vmovlps_avx(auVar69._0_16_);
          auVar76 = ZEXT6064((undefined1  [60])0x0) << 0x20;
          BSDF::Sample_f(&bs,&bsdf,(Vector3f)VVar80.super_Tuple3<pbrt::Vector3,_float>,FVar41,
                         (Point2f *)&rrBeta,Radiance,All);
          auVar75 = auVar76._0_16_;
          auVar78 = auVar76._8_56_;
          bVar33 = true;
          if (0.0 < bs.pdf) {
            tVar43 = AbsDot<float>(&bs.wi,&(pSVar35->intr).shading.n);
            auVar74 = extraout_var_01;
            SVar81 = SampledSpectrum::operator*(&bs.f,tVar43);
            auVar26._8_56_ = auVar78;
            auVar26._0_8_ = SVar81.values.values._8_8_;
            auVar70._0_8_ = SVar81.values.values._0_8_;
            auVar70._8_56_ = auVar74;
            albedo.values.values = (array<float,_4>)vmovlhps_avx(auVar70._0_16_,auVar26._0_16_);
            auVar74 = (undefined1  [56])0x0;
            SVar81 = SampledSpectrum::operator/(&albedo,bs.pdf);
            auVar27._8_56_ = auVar78;
            auVar27._0_8_ = SVar81.values.values._8_8_;
            auVar71._0_8_ = SVar81.values.values._0_8_;
            auVar71._8_56_ = auVar74;
            auVar75 = vmovlhps_avx(auVar71._0_16_,auVar27._0_16_);
            rrBeta.values.values._0_8_ = auVar75._0_8_;
            rrBeta.values.values[2] = auVar75._8_4_;
            rrBeta.values.values[3] = auVar75._12_4_;
            SampledSpectrum::operator*=(&beta,&rrBeta);
            if (bsdf.bxdf.
                super_TaggedPointer<pbrt::IdealDiffuseBxDF,_pbrt::DiffuseBxDF,_pbrt::CoatedDiffuseBxDF,_pbrt::CoatedConductorBxDF,_pbrt::DielectricInterfaceBxDF,_pbrt::ThinDielectricBxDF,_pbrt::HairBxDF,_pbrt::MeasuredBxDF,_pbrt::ConductorBxDF,_pbrt::BSSRDFAdapter>
                .bits._6_2_ - 3 < 2) {
              wiRender.super_Tuple3<pbrt::Vector3,_float>.z =
                   bs.wi.super_Tuple3<pbrt::Vector3,_float>.z;
              wiRender.super_Tuple3<pbrt::Vector3,_float>.x =
                   bs.wi.super_Tuple3<pbrt::Vector3,_float>.x;
              wiRender.super_Tuple3<pbrt::Vector3,_float>.y =
                   bs.wi.super_Tuple3<pbrt::Vector3,_float>.y;
              f = BSDF::PDF(&bsdf,(Vector3f)VVar80.super_Tuple3<pbrt::Vector3,_float>,wiRender,
                            Radiance,All);
            }
            else {
              f = bs.pdf;
            }
            FVar41 = bsdf.eta;
            BVar38 = bs.flags & Specular;
            bVar33 = (bs.flags & Transmission) == Unset;
            pSVar36 = pstd::optional<pbrt::ShapeIntersection>::value(&si);
            local_1f8 = (pSVar36->intr).super_Interaction.pi.super_Point3<pbrt::Interval<float>_>.
                        super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.x;
            IStack_1f0 = (pSVar36->intr).super_Interaction.pi.super_Point3<pbrt::Interval<float>_>.
                         super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.y;
            IStack_1e8 = (pSVar36->intr).super_Interaction.pi.super_Point3<pbrt::Interval<float>_>.
                         super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.z;
            uVar2 = (pSVar36->intr).super_Interaction.time;
            uVar3 = (pSVar36->intr).super_Interaction.wo.super_Tuple3<pbrt::Vector3,_float>.x;
            uVar4 = (pSVar36->intr).super_Interaction.wo.super_Tuple3<pbrt::Vector3,_float>.y;
            uVar5 = (pSVar36->intr).super_Interaction.wo.super_Tuple3<pbrt::Vector3,_float>.z;
            uVar6 = (pSVar36->intr).super_Interaction.n.super_Tuple3<pbrt::Normal3,_float>.x;
            uVar7 = (pSVar36->intr).super_Interaction.n.super_Tuple3<pbrt::Normal3,_float>.y;
            uVar8 = *(undefined8 *)
                     &(pSVar36->intr).super_Interaction.n.super_Tuple3<pbrt::Normal3,_float>.z;
            uVar9 = *(undefined8 *)
                     &(pSVar36->intr).super_Interaction.uv.super_Tuple2<pbrt::Point2,_float>.y;
            fStack_1c8 = (float)uVar8;
            uStack_1c4 = (undefined4)((ulong)uVar8 >> 0x20);
            uStack_1c0 = (undefined4)uVar9;
            uStack_1bc = (undefined4)((ulong)uVar9 >> 0x20);
            fStack_78 = (pSVar36->intr).shading.n.super_Tuple3<pbrt::Normal3,_float>.x;
            fStack_74 = (pSVar36->intr).shading.n.super_Tuple3<pbrt::Normal3,_float>.y;
            fStack_70 = (pSVar36->intr).shading.n.super_Tuple3<pbrt::Normal3,_float>.z;
            uStack_1e0 = uVar2;
            uStack_1dc = uVar3;
            uStack_1d8 = uVar4;
            uStack_1d4 = uVar5;
            fStack_1d0 = (float)uVar6;
            fStack_1cc = (float)uVar7;
            SurfaceInteraction::SpawnRay
                      ((RayDifferential *)&rrBeta,&pSVar35->intr,ray,&bsdf,&bs.wi,bs.flags);
            FVar41 = (Float)((uint)bVar33 * local_268._0_4_ +
                            (uint)!bVar33 * (int)((float)local_268._0_4_ * FVar41 * FVar41));
            local_268 = ZEXT416((uint)FVar41);
            (ray->super_Ray).d.super_Tuple3<pbrt::Vector3,_float>.x = rrBeta.values.values[3];
            (ray->super_Ray).d.super_Tuple3<pbrt::Vector3,_float>.y =
                 VStack_368.super_Tuple3<pbrt::Vector3,_float>.x;
            *(ulong *)&(ray->super_Ray).d.super_Tuple3<pbrt::Vector3,_float>.z =
                 CONCAT44(VStack_368.super_Tuple3<pbrt::Vector3,_float>.z,
                          VStack_368.super_Tuple3<pbrt::Vector3,_float>.y);
            (ray->super_Ray).o.super_Tuple3<pbrt::Point3,_float>.x = rrBeta.values.values[0];
            (ray->super_Ray).o.super_Tuple3<pbrt::Point3,_float>.y = rrBeta.values.values[1];
            *(ulong *)&(ray->super_Ray).o.super_Tuple3<pbrt::Point3,_float>.z =
                 CONCAT44(rrBeta.values.values[3],rrBeta.values.values[2]);
            (ray->super_Ray).medium.
            super_TaggedPointer<pbrt::HomogeneousMedium,_pbrt::GeneralMedium<pbrt::UniformGridMediumProvider>,_pbrt::GeneralMedium<pbrt::CloudMediumProvider>,_pbrt::GeneralMedium<pbrt::NanoVDBMediumProvider>_>
            .bits = TStack_358.bits;
            auVar29._8_4_ = fStack_348;
            auVar29._12_4_ = fStack_344;
            auVar29[0] = uStack_350._0_1_;
            auVar29._1_3_ = uStack_350._1_3_;
            auVar29._4_4_ = uStack_350._4_4_;
            auVar29._16_4_ = fStack_340;
            auVar29._20_4_ = fStack_33c;
            auVar29._24_4_ = local_338;
            auVar29._28_4_ = fStack_334;
            *(ulong *)(local_298 + 0x14) = CONCAT44(local_338,fStack_33c);
            (((Vector3f *)(local_298 + 0x1c))->super_Tuple3<pbrt::Vector3,_float>).x = fStack_334;
            (((Vector3f *)(local_298 + 0x1c))->super_Tuple3<pbrt::Vector3,_float>).y = fStack_330;
            *(undefined8 *)(local_298 + 0x24) = uStack_32c;
            *(undefined8 *)(local_298 + 0x2c) = uStack_324;
            *(undefined1 (*) [32])local_298 = auVar29;
            auVar74 = ZEXT856(0);
            auVar78 = ZEXT856(CONCAT44(fStack_330,fStack_334));
            SVar81 = SampledSpectrum::operator*(&beta,FVar41);
            auVar28._8_56_ = auVar78;
            auVar28._0_8_ = SVar81.values.values._8_8_;
            auVar72._0_8_ = SVar81.values.values._0_8_;
            auVar72._8_56_ = auVar74;
            auVar75 = vmovlhps_avx(auVar72._0_16_,auVar28._0_16_);
            rrBeta.values.values._0_8_ = auVar75._0_8_;
            rrBeta.values.values[2] = auVar75._8_4_;
            rrBeta.values.values[3] = auVar75._12_4_;
            FVar41 = SampledSpectrum::MaxComponentValue(&rrBeta);
            auVar75 = ZEXT416((uint)this->rrThreshold);
            if (iVar32 < 1 || this->rrThreshold <= FVar41) {
LAB_0042e0ef:
              bVar33 = false;
            }
            else {
              FVar41 = SampledSpectrum::MaxComponentValue(&rrBeta);
              FVar42 = TaggedPointer<pbrt::HaltonSampler,pbrt::PaddedSobolSampler,pbrt::PMJ02BNSampler,pbrt::RandomSampler,pbrt::SobolSampler,pbrt::StratifiedSampler,pbrt::MLTSampler,pbrt::DebugMLTSampler>
                       ::Dispatch<pbrt::SamplerHandle::Get1D()::_lambda(auto:1)_1_>
                                 ((TaggedPointer<pbrt::HaltonSampler,pbrt::PaddedSobolSampler,pbrt::PMJ02BNSampler,pbrt::RandomSampler,pbrt::SobolSampler,pbrt::StratifiedSampler,pbrt::MLTSampler,pbrt::DebugMLTSampler>
                                   *)sampler);
              bVar33 = true;
              auVar75 = vmaxss_avx(ZEXT416((uint)(1.0 - FVar41)),ZEXT416(0));
              if (auVar75._0_4_ <= FVar42) {
                SampledSpectrum::operator/=(&beta,1.0 - auVar75._0_4_);
                goto LAB_0042e0ef;
              }
            }
            local_428 = BVar38 >> 4;
            bVar34 = bVar34 | BVar38 == Unset;
          }
        }
      }
    }
    iVar32 = iVar40;
    in_ZMM1 = ZEXT1664(auVar75);
    pstd::optional<pbrt::ShapeIntersection>::~optional(&si);
    if (bVar33) {
      lVar37 = (long)iVar32;
      *(long *)(in_FS_OFFSET + -0x348) = *(long *)(in_FS_OFFSET + -0x348) + 1;
      *(long *)(in_FS_OFFSET + -0x350) = *(long *)(in_FS_OFFSET + -0x350) + lVar37;
      lVar39 = *(long *)(in_FS_OFFSET + -0x7a0);
      if (lVar37 <= *(long *)(in_FS_OFFSET + -0x7a0)) {
        lVar39 = lVar37;
      }
      if (lVar37 < *(long *)(in_FS_OFFSET + -0x798)) {
        lVar37 = *(long *)(in_FS_OFFSET + -0x798);
      }
      *(long *)(in_FS_OFFSET + -0x7a0) = lVar39;
      *(long *)(in_FS_OFFSET + -0x798) = lVar37;
      return (SampledSpectrum)L.values;
    }
  } while( true );
}

Assistant:

SampledSpectrum PathIntegrator::Li(RayDifferential ray, SampledWavelengths &lambda,
                                   SamplerHandle sampler, ScratchBuffer &scratchBuffer,
                                   VisibleSurface *visibleSurface) const {
    SampledSpectrum L(0.f), beta(1.f);
    bool specularBounce = false, anyNonSpecularBounces = false;
    int depth = 0;
    Float etaScale = 1, bsdfPDF;
    SurfaceInteraction prevIntr;

    while (true) {
        // Find next path vertex and accumulate contribution
        pstd::optional<ShapeIntersection> si = Intersect(ray);
        // Add emitted light at path vertex or from the environment
        if (!si) {
            // Incorporate emission from infinite lights for escaped ray
            for (const auto &light : infiniteLights) {
                SampledSpectrum Le = light.Le(ray, lambda);
                if (depth == 0 || specularBounce)
                    L += SafeDiv(beta * Le, lambda.PDF());
                else {
                    // Compute MIS weight for infinite light
                    Float lightPDF =
                        lightSampler.PDF(prevIntr, light) *
                        light.PDF_Li(prevIntr, ray.d, LightSamplingMode::WithMIS);
                    Float weight = PowerHeuristic(1, bsdfPDF, 1, lightPDF);

                    L += SafeDiv(beta * weight * Le, lambda.PDF());
                }
            }

            break;
        }
        // Incorporate emission from emissive surface hit by ray
        SampledSpectrum Le = si->intr.Le(-ray.d, lambda);
        if (Le) {
            if (depth == 0 || specularBounce)
                L += SafeDiv(beta * Le, lambda.PDF());
            else {
                // Compute MIS weight for area light
                LightHandle areaLight(si->intr.areaLight);
                Float lightPDF =
                    lightSampler.PDF(prevIntr, areaLight) *
                    areaLight.PDF_Li(prevIntr, ray.d, LightSamplingMode::WithMIS);
                Float weight = PowerHeuristic(1, bsdfPDF, 1, lightPDF);

                L += SafeDiv(beta * weight * Le, lambda.PDF());
            }
        }

        SurfaceInteraction &isect = si->intr;

        // Compute scattering functions and skip over medium boundaries
        BSDF bsdf = isect.GetBSDF(ray, lambda, camera, scratchBuffer, sampler);
        if (!bsdf) {
            isect.SkipIntersection(&ray, si->tHit);
            continue;
        }

        // Initialize _visibleSurface_ at first intersection
        if (depth == 0 && visibleSurface != nullptr) {
            // Estimate BSDF's albedo
            constexpr int nRhoSamples = 16;
            SampledSpectrum rho(0.f);
            for (int i = 0; i < nRhoSamples; ++i) {
                // Generate sample for hemispherical-directional reflectance
                Float uc = RadicalInverse(0, i + 1);
                Point2f u(RadicalInverse(1, i + 1), RadicalInverse(2, i + 1));

                // Estimate one term of $\rho_\roman{hd}$
                auto bs = bsdf.Sample_f(si->intr.wo, uc, u);
                if (bs && bs.pdf > 0)
                    rho += bs.f * AbsDot(bs.wi, si->intr.shading.n) / bs.pdf;
            }
            SampledSpectrum albedo = rho / nRhoSamples;

            *visibleSurface =
                VisibleSurface(si->intr, camera.GetCameraTransform(), albedo, lambda);
        }

        // End path if maximum depth reached
        if (depth++ == maxDepth)
            break;

        // Possibly regularize the BSDF
        if (regularize && anyNonSpecularBounces) {
            ++regularizedBSDFs;
            bsdf.Regularize();
        }

        ++totalBSDFs;
        // Sample direct illumination from the light sources
        if (bsdf.IsNonSpecular()) {
            ++totalPaths;
            SampledSpectrum Ld = SampleLd(isect, bsdf, lambda, sampler);
            if (!Ld)
                ++zeroRadiancePaths;
            L += SafeDiv(beta * Ld, lambda.PDF());
        }

        // Sample BSDF to get new path direction
        Vector3f wo = -ray.d;
        Float u = sampler.Get1D();
        BSDFSample bs = bsdf.Sample_f(wo, u, sampler.Get2D());
        if (!bs)
            break;
        // Update path state variables for after surface scattering
        beta *= bs.f * AbsDot(bs.wi, isect.shading.n) / bs.pdf;
        bsdfPDF = bsdf.SampledPDFIsProportional() ? bsdf.PDF(wo, bs.wi) : bs.pdf;
        DCHECK(!IsInf(beta.y(lambda)));
        specularBounce = bs.IsSpecular();
        anyNonSpecularBounces |= !bs.IsSpecular();
        if (bs.IsTransmission())
            etaScale *= Sqr(bsdf.eta);
        prevIntr = si->intr;

        ray = isect.SpawnRay(ray, bsdf, bs.wi, bs.flags);

        // Possibly terminate the path with Russian roulette
        SampledSpectrum rrBeta = beta * etaScale;
        if (rrBeta.MaxComponentValue() < rrThreshold && depth > 1) {
            Float q = std::max<Float>(0, 1 - rrBeta.MaxComponentValue());
            if (sampler.Get1D() < q)
                break;
            beta /= 1 - q;
            DCHECK(!IsInf(beta.y(lambda)));
        }
    }
    ReportValue(pathLength, depth);
    return L;
}